

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O0

Vec_Int_t * Acec_MapMajOuts2(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vRanks)

{
  int iVar1;
  Vec_Int_t *p_00;
  undefined4 local_2c;
  int i;
  Vec_Int_t *vMap;
  Vec_Int_t *vRanks_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStartFull(iVar1);
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vAdds);
    if (iVar1 <= local_2c * 6) break;
    iVar1 = Vec_IntEntry(vAdds,local_2c * 6 + 4);
    iVar1 = Vec_IntEntry(vRanks,iVar1);
    if (iVar1 != -1) {
      iVar1 = Vec_IntEntry(vAdds,local_2c * 6 + 4);
      Vec_IntWriteEntry(p_00,iVar1,local_2c);
    }
    local_2c = local_2c + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acec_MapMajOuts2( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vRanks )
{
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
        if ( Vec_IntEntry(vRanks, Vec_IntEntry(vAdds, 6*i+4)) != -1 )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vAdds, 6*i+4), i );
    return vMap;
}